

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

bool __thiscall Client::conn_svr(Client *this)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined1 local_2c [4];
  int flags;
  sockaddr_in client_addr;
  int sock_fd;
  Client *this_local;
  
  unique0x1000021c = this;
  client_addr.sin_zero._0_4_ = socket(2,1,0);
  pFVar1 = _stderr;
  if ((int)client_addr.sin_zero._0_4_ < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar1,"%s(%d)-<%s>: client sock creation failed, status %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
            ,10,"conn_svr",pcVar5);
    fflush(_stderr);
    this_local._7_1_ = false;
  }
  else {
    this->_sock_fd = client_addr.sin_zero._0_4_;
    memset(local_2c,0,0x10);
    local_2c._0_2_ = 2;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    flags = inet_addr(pcVar5);
    local_2c._2_2_ = htons((uint16_t)this->_svr_port);
    iVar2 = connect(this->_sock_fd,(sockaddr *)local_2c,0x10);
    pFVar1 = _stderr;
    if (iVar2 < 0) {
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s(%d)-<%s>: connect to server[%s:%d] failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0x18,"conn_svr",uVar6,this->_svr_port);
      fflush(_stderr);
      this_local._7_1_ = false;
    }
    else {
      uVar3 = fcntl(this->_sock_fd,3,0);
      fcntl(this->_sock_fd,4,(ulong)(uVar3 | 0x800));
      uVar3 = fcntl(0,3);
      fcntl(0,4,(ulong)(uVar3 | 0x800));
      uVar3 = fcntl(1,3,0);
      fcntl(1,4,(ulong)(uVar3 | 0x800));
      Epoll::create_epool(&this->_epoll,4);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Client::conn_svr()
{
    int sock_fd;
    
    if ((sock_fd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
    {
        LOG_PRINT("client sock creation failed, status %s", strerror(errno));
        return false;
    }
    _sock_fd = sock_fd;

    struct sockaddr_in client_addr;

    bzero(&client_addr, sizeof(client_addr));
    client_addr.sin_family = AF_INET;
    client_addr.sin_addr.s_addr = inet_addr(_svr_ip.c_str());
    client_addr.sin_port = htons(_svr_port);

    if (connect(_sock_fd, (struct sockaddr *)&client_addr, sizeof(struct sockaddr)) < 0)
    {
        LOG_PRINT("connect to server[%s:%d] failed", _svr_ip.c_str(), _svr_port);
        return false;
    }

    int flags = fcntl(_sock_fd, F_GETFL, 0);
    fcntl(_sock_fd, F_SETFL, flags | O_NONBLOCK);

    flags = fcntl(STDIN_FILENO, F_GETFL, 0);
    fcntl(STDIN_FILENO, F_SETFL, flags | O_NONBLOCK);

    flags = fcntl(STDOUT_FILENO, F_GETFL, 0);
    fcntl(STDOUT_FILENO, F_SETFL, flags | O_NONBLOCK);

    _epoll.create_epool(kMax_conn_size);

    return true;
}